

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O0

apx_error_t
apx_socketServerConnection_create(apx_socketServerConnection_t *self,msocket_t *socket_object)

{
  undefined1 local_98 [4];
  apx_error_t retval;
  apx_connectionInterface_t connection_interface;
  apx_connectionBaseVTable_t base_connection_vtable;
  msocket_t *socket_object_local;
  apx_socketServerConnection_t *self_local;
  
  if ((self == (apx_socketServerConnection_t *)0x0) || (socket_object == (msocket_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    self->default_buffer_size = 0x1000;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              (&connection_interface.remote_file_write_notification,
               apx_socketServerConnection_vdestroy,apx_socketServerConnection_vstart,
               apx_socketServerConnection_vclose);
    create_connection_interface_vtable(self,(apx_connectionInterface_t *)local_98);
    self_local._4_4_ =
         apx_serverConnection_create
                   (self,&connection_interface.remote_file_write_notification,local_98);
    if (self_local._4_4_ == 0) {
      adt_bytearray_create(&self->send_buffer,0x1000);
      register_msocket_handler(self,socket_object);
      apx_nodeManager_create(&self->node_manager,2);
      apx_serverConnection_attach_node_manager(self,&self->node_manager);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_socketServerConnection_create(apx_socketServerConnection_t *self, SOCKET_TYPE *socket_object)
{
   if ( (self != NULL) && (socket_object != NULL) )
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      MUTEX_INIT(self->lock);
      self->default_buffer_size = SEND_BUFFER_GROW_SIZE;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
         apx_socketServerConnection_vdestroy,
         apx_socketServerConnection_vstart,
         apx_socketServerConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t retval = apx_serverConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (retval == APX_NO_ERROR)
      {
         adt_bytearray_create(&self->send_buffer, SEND_BUFFER_GROW_SIZE);
         register_msocket_handler(self, socket_object);
      }
      if (retval == APX_NO_ERROR)
      {
         apx_nodeManager_create(&self->node_manager, APX_SERVER_MODE);
         apx_serverConnection_attach_node_manager(&self->base, &self->node_manager);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}